

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

Var Js::JavascriptPromise::PromiseResolve(Var constructor,Var value,ScriptContext *scriptContext)

{
  bool bVar1;
  Var pvVar2;
  
  bVar1 = VarIs<Js::JavascriptPromise>(value);
  if (bVar1) {
    pvVar2 = JavascriptOperators::GetProperty
                       ((RecyclableObject *)value,0x67,scriptContext,(PropertyValueInfo *)0x0);
    bVar1 = JavascriptConversion::SameValueCommon<false>(pvVar2,constructor);
    if (bVar1) {
      return value;
    }
  }
  pvVar2 = CreateResolvedPromise(value,scriptContext,constructor);
  return pvVar2;
}

Assistant:

Var JavascriptPromise::PromiseResolve(Var constructor, Var value, ScriptContext* scriptContext)
    {
        if (VarIs<JavascriptPromise>(value))
        {
            Var valueConstructor = JavascriptOperators::GetProperty(
                (RecyclableObject*)value,
                PropertyIds::constructor,
                scriptContext);

            // If `value` is a Promise or Promise subclass instance and its "constructor"
            // property is `constructor`, then return the value unchanged
            if (JavascriptConversion::SameValue(valueConstructor, constructor))
            {
                return value;
            }
        }

        return CreateResolvedPromise(value, scriptContext, constructor);
    }